

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O2

QuadTerms * __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::ExtractSum
          (QuadTerms *__return_storage_ptr__,BucketAccum1Type<mp::QuadTerms> *this)

{
  size_ty sVar1;
  size_ty *psVar2;
  ulong i;
  QuadTerms local_2b0;
  QuadTerms local_170;
  
  QuadTerms::QuadTerms(__return_storage_ptr__);
  psVar2 = &(this->buckets_)._M_elems[1].folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_size;
  i = 0;
  do {
    if (i == 0x40) {
LAB_0028a317:
      while (i < 0x3f) {
        i = i + 1;
        if (*psVar2 != 0) {
          sVar1 = (__return_storage_ptr__->folded_).
                  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                  .m_data.
                  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                  .m_size;
          if (sVar1 == 0) {
            ExtractBucket(&local_2b0,this,i);
          }
          else {
            ExtractBucket(&local_170,this,i);
            MergeSorted<mp::QuadTerms>(&local_2b0,&local_170,__return_storage_ptr__);
          }
          QuadTerms::operator=(__return_storage_ptr__,&local_2b0);
          QuadTerms::~QuadTerms(&local_2b0);
          if (sVar1 != 0) {
            QuadTerms::~QuadTerms(&local_170);
          }
        }
        psVar2 = psVar2 + 0x28;
      }
      return __return_storage_ptr__;
    }
    if (psVar2[-0x28] != 0) {
      ExtractBucket(&local_2b0,this,i);
      QuadTerms::operator=(__return_storage_ptr__,&local_2b0);
      QuadTerms::~QuadTerms(&local_2b0);
      goto LAB_0028a317;
    }
    i = i + 1;
    psVar2 = psVar2 + 0x28;
  } while( true );
}

Assistant:

Body BucketAccum1Type<Body>::ExtractSum() {
  Body result;

  size_t i_bucket = 0;
  for ( ; i_bucket<buckets_.size(); ++i_bucket)
    if (HasBucket(i_bucket)) {
      result = ExtractBucket(i_bucket);
      break;
    }

  while ( ++i_bucket<buckets_.size())
    if (HasBucket(i_bucket)) {
      result
          = result.size()
          ? MergeSorted(ExtractBucket(i_bucket), result)
          : ExtractBucket(i_bucket);
    }

  return result;
}